

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algs.h
# Opt level: O1

void __thiscall
dlib::bfp1_helpers::bound_function_helper<void,_int,_void,_void,_void>::call
          (bound_function_helper<void,_int,_void,_void,_void> *this)

{
  long *plVar1;
  undefined8 in_RDX;
  
  plVar1 = (long *)(this->super_bound_function_helper_base<int,_void,_void,_void>).mfp.
                   super_mfp_kernel_1_base_class<1UL>.mp_memory.data;
  if (plVar1[1] != 0) {
    (**(code **)(*plVar1 + 0x20))
              (plVar1,*(this->super_bound_function_helper_base<int,_void,_void,_void>).arg1,in_RDX,
               *(code **)(*plVar1 + 0x20));
    return;
  }
  if (this->fp != (_func_void_int *)0x0) {
    (*this->fp)(*(this->super_bound_function_helper_base<int,_void,_void,_void>).arg1);
    return;
  }
  return;
}

Assistant:

const void* get () const { return data; }